

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLURL *baseURL,XMLCh *relativeURL)

{
  CleanupType_conflict6 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLURL> local_20;
  
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_004025b0;
  this->fMemoryManager = baseURL->fMemoryManager;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fPortNum = 0;
  this->fProtocol = Unknown;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  *(undefined8 *)((long)&this->fUser + 1) = 0;
  *(undefined8 *)((long)&this->fURLText + 1) = 0;
  local_20.fToCall = (MFPT)cleanUp;
  local_20._16_8_ = 0;
  local_20.fObject = this;
  setURL(this,baseURL,relativeURL);
  local_20.fObject = (XMLURL *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall(&local_20);
  return;
}

Assistant:

XMLURL::XMLURL(const XMLURL&         baseURL
             , const XMLCh* const    relativeURL) :

    fMemoryManager(baseURL.fMemoryManager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(0)
    , fProtocol(XMLURL::Unknown)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(false)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

	try
	{
		setURL(baseURL, relativeURL);
	}
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}